

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

NFABaseState<char,_int> * __thiscall
Centaurus::NFABaseState<char,_int>::offset
          (NFABaseState<char,_int> *__return_storage_ptr__,NFABaseState<char,_int> *this,int value)

{
  bool bVar1;
  NFATransition<char> local_78;
  reference local_40;
  NFATransition<char> *transition;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range2
  ;
  int value_local;
  NFABaseState<char,_int> *this_local;
  NFABaseState<char,_int> *new_state;
  
  NFABaseState(__return_storage_ptr__);
  __end0 = std::
           vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ::begin(&this->m_transitions);
  transition = (NFATransition<char> *)
               std::
               vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ::end(&this->m_transitions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                     *)&transition), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
               ::operator*(&__end0);
    NFATransition<char>::offset(&local_78,local_40,value);
    add_transition(__return_storage_ptr__,&local_78);
    NFATransition<char>::~NFATransition(&local_78);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

NFABaseState<TCHAR, TLABEL> offset(int value) const
    {
        NFABaseState<TCHAR, TLABEL> new_state;

        for (const auto& transition : m_transitions)
        {
            new_state.add_transition(transition.offset(value));
        }

        return new_state;
    }